

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_for_testing.hpp
# Opt level: O2

void HelpersForTests::print_nz_inds<std::array<bool,6144ul>>(array<bool,_6144UL> *vec)

{
  ostream *poVar1;
  array<bool,_6144UL> *__range2;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x1800; lVar2 = lVar2 + 1) {
    if (vec->_M_elems[lVar2] == true) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar1,' ');
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void print_nz_inds(const T &vec) {
        std::size_t i{};
        for (auto val : vec) {
            if (val != 0) {
                std::cout << i << ' ';
            }
            i++;
        }
        std::cout << std::endl;
    }